

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall diligent_spirv_cross::ParsedIR::add_typed_id(ParsedIR *this,Types type,ID id)

{
  Types type_00;
  Variant *pVVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  CompilerError *this_00;
  long lVar5;
  long lVar6;
  
  uVar4 = (ulong)id.id;
  if ((this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size <= uVar4) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x3a3,"void diligent_spirv_cross::ParsedIR::add_typed_id(Types, ID)");
  }
  if (this->loop_iteration_depth_hard == 0) {
    pVVar1 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr;
    if (this->loop_iteration_depth_soft == 0) {
      if ((pVVar1[uVar4].holder == (IVariant *)0x0) || (pVVar1[uVar4].type != type)) {
        switch(type) {
        case TypeVariable:
          lVar6 = 0x480;
          lVar5 = 0x478;
          break;
        case TypeConstant:
          SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                    (&this->ids_for_constant_or_variable,
                     (this->ids_for_constant_or_variable).
                     super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                     .buffer_size + 1);
          sVar3 = (this->ids_for_constant_or_variable).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                  buffer_size;
          (this->ids_for_constant_or_variable).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr
          [sVar3].id = id.id;
          (this->ids_for_constant_or_variable).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size = sVar3 + 1;
        case TypeType:
        case TypeConstantOp:
        case TypeUndef:
          lVar6 = 0x448;
          lVar5 = 0x440;
          break;
        default:
          goto switchD_007c087a_caseD_4;
        }
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                  ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                    *)((this->ids).stack_storage.aligned_char + lVar5 + -0x38),
                   *(long *)((this->ids).stack_storage.aligned_char + lVar6 + -0x38) + 1);
        lVar2 = *(long *)((this->ids).stack_storage.aligned_char + lVar6 + -0x38);
        *(uint32_t *)(*(long *)((this->ids).stack_storage.aligned_char + lVar5 + -0x38) + lVar2 * 4)
             = id.id;
        *(long *)((this->ids).stack_storage.aligned_char + lVar6 + -0x38) = lVar2 + 1;
      }
switchD_007c087a_caseD_4:
      pVVar1 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar1[uVar4].holder != (IVariant *)0x0) {
        type_00 = pVVar1[uVar4].type;
        if (type_00 == type) {
          return;
        }
        remove_typed_id(this,type_00,id);
      }
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                (this->ids_for_type + type,
                 this->ids_for_type[type].
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 buffer_size + 1);
      sVar3 = this->ids_for_type[type].
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      this->ids_for_type[type].
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar3].id
           = id.id;
      this->ids_for_type[type].
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size =
           sVar3 + 1;
      return;
    }
    if (pVVar1[uVar4].holder == (IVariant *)0x0) {
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot override IDs when loop is soft locked.");
  }
  else {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot add typed ID while looping over it.");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParsedIR::add_typed_id(Types type, ID id)
{
	assert(id < ids.size());

	if (loop_iteration_depth_hard != 0)
		SPIRV_CROSS_THROW("Cannot add typed ID while looping over it.");

	if (loop_iteration_depth_soft != 0)
	{
		if (!ids[id].empty())
			SPIRV_CROSS_THROW("Cannot override IDs when loop is soft locked.");
		return;
	}

	if (ids[id].empty() || ids[id].get_type() != type)
	{
		switch (type)
		{
		case TypeConstant:
			ids_for_constant_or_variable.push_back(id);
			ids_for_constant_undef_or_type.push_back(id);
			break;

		case TypeVariable:
			ids_for_constant_or_variable.push_back(id);
			break;

		case TypeType:
		case TypeConstantOp:
		case TypeUndef:
			ids_for_constant_undef_or_type.push_back(id);
			break;

		default:
			break;
		}
	}

	if (ids[id].empty())
	{
		ids_for_type[type].push_back(id);
	}
	else if (ids[id].get_type() != type)
	{
		remove_typed_id(ids[id].get_type(), id);
		ids_for_type[type].push_back(id);
	}
}